

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cxx
# Opt level: O2

void __thiscall
cmsys::CommandLineArguments::AddArgument
          (CommandLineArguments *this,char *argument,ArgumentTypeEnum type,VariableTypeEnum vtype,
          void *variable,char *help)

{
  Internal *pIVar1;
  mapped_type *pmVar2;
  String local_50;
  
  pIVar1 = this->Internals;
  String::String(&local_50,argument);
  pmVar2 = std::
           map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
           ::operator[](&(pIVar1->Callbacks).
                         super_map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
                        ,&local_50);
  pmVar2->Argument = argument;
  pmVar2->ArgumentType = type;
  pmVar2->Callback = (CallbackType)0x0;
  pmVar2->CallData = (void *)0x0;
  pmVar2->Variable = variable;
  pmVar2->VariableType = vtype;
  pmVar2->Help = help;
  std::__cxx11::string::~string((string *)&local_50);
  GenerateHelp(this);
  return;
}

Assistant:

void CommandLineArguments::AddArgument(const char* argument,
                                       ArgumentTypeEnum type,
                                       VariableTypeEnum vtype, void* variable,
                                       const char* help)
{
  CommandLineArgumentsCallbackStructure s;
  s.Argument = argument;
  s.ArgumentType = type;
  s.Callback = KWSYS_NULLPTR;
  s.CallData = KWSYS_NULLPTR;
  s.VariableType = vtype;
  s.Variable = variable;
  s.Help = help;

  this->Internals->Callbacks[argument] = s;
  this->GenerateHelp();
}